

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O2

void ngrams_raw_free(ngram_raw_t **raw_ngrams,uint32 *counts,int order)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = 1;
  if (1 < order) {
    iVar1 = order;
  }
  uVar3 = 0;
  while (uVar3 != iVar1 - 1) {
    lVar2 = 0;
    for (uVar4 = 0; uVar4 < counts[uVar3 + 1]; uVar4 = uVar4 + 1) {
      ckd_free(*(void **)((long)&raw_ngrams[uVar3]->words + lVar2));
      lVar2 = lVar2 + 0x18;
    }
    ckd_free(raw_ngrams[uVar3]);
    uVar3 = uVar3 + 1;
  }
  ckd_free(raw_ngrams);
  return;
}

Assistant:

void
ngrams_raw_free(ngram_raw_t ** raw_ngrams, uint32 * counts, int order)
{
    uint32 num;
    int order_it;

    for (order_it = 0; order_it < order - 1; order_it++) {
        for (num = 0; num < counts[order_it + 1]; num++) {
            ckd_free(raw_ngrams[order_it][num].words);
        }
        ckd_free(raw_ngrams[order_it]);
    }
    ckd_free(raw_ngrams);
}